

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

void __thiscall
spvtools::val::Function::RegisterExecutionModelLimitation
          (Function *this,ExecutionModel model,string *message)

{
  anon_class_40_2_bfd809a7 local_68;
  value_type local_40;
  string *local_20;
  string *message_local;
  Function *pFStack_10;
  ExecutionModel model_local;
  Function *this_local;
  
  local_68.model = model;
  local_20 = message;
  message_local._4_4_ = model;
  pFStack_10 = this;
  std::__cxx11::string::string((string *)&local_68.message,(string *)message);
  std::function<bool(spv::ExecutionModel,std::__cxx11::string*)>::
  function<spvtools::val::Function::RegisterExecutionModelLimitation(spv::ExecutionModel,std::__cxx11::string_const&)::__0,void>
            ((function<bool(spv::ExecutionModel,std::__cxx11::string*)> *)&local_40,&local_68);
  std::__cxx11::
  list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
  ::push_back(&this->execution_model_limitations_,&local_40);
  std::
  function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function(&local_40);
  RegisterExecutionModelLimitation(spv::ExecutionModel,std::__cxx11::string_const&)::$_0::~__0
            ((__0 *)&local_68);
  return;
}

Assistant:

void Function::RegisterExecutionModelLimitation(spv::ExecutionModel model,
                                                const std::string& message) {
  execution_model_limitations_.push_back(
      [model, message](spv::ExecutionModel in_model, std::string* out_message) {
        if (model != in_model) {
          if (out_message) {
            *out_message = message;
          }
          return false;
        }
        return true;
      });
}